

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg-queue.c
# Opt level: O0

ndn_msg * ndn_msgqueue_post(void *target,ndn_msg_callback reason,size_t param_length,void *param)

{
  ndn_msg_t *pnVar1;
  ndn_msg_t *ret;
  size_t space;
  size_t len;
  void *param_local;
  size_t param_length_local;
  ndn_msg_callback reason_local;
  void *target_local;
  
  pnVar1 = (ndn_msg_t *)(param_length + 0x18);
  ndn_msgqueue_empty();
  if (ptail < pfront) {
    ret = (ndn_msg_t *)((long)pfront + (-1 - (long)ptail));
  }
  else {
    ret = (ndn_msg_t *)((long)&psplit - (long)ptail);
  }
  if ((pfront < ptail) && (ret < (ndn_msg_t *)(param_length + 0x30))) {
    if ((long)(pfront + -0xdaa4) <= (long)(int)pnVar1) {
      return (ndn_msg *)0x0;
    }
    if (ret < (ndn_msg_t *)0x18) {
      return (ndn_msg *)0x0;
    }
    ptail->func = (ndn_msg_callback)0xffffffffffffffff;
    ptail->length = (size_t)ret;
    ptail = (ndn_msg_t *)msg_queue;
  }
  else if ((ret < pnVar1) || ((ret == pnVar1 && (pfront == (ndn_msg_t *)msg_queue)))) {
    return (ndn_msg *)0x0;
  }
  ptail->obj = target;
  ptail->func = reason;
  ptail->length = (size_t)pnVar1;
  if (param_length != 0) {
    memcpy(ptail + 1,param,param_length);
  }
  pnVar1 = ptail;
  ptail = (ndn_msg_t *)((long)&ptail->obj + ptail->length);
  if ((ndn_msg_t *)(msg_queue + 0xfff) < ptail) {
    ptail = (ndn_msg_t *)msg_queue;
  }
  return pnVar1;
}

Assistant:

struct ndn_msg*
ndn_msgqueue_post(void *target,
                  ndn_msg_callback reason,
                  size_t param_length,
                  void *param)
{
  size_t len = param_length + sizeof(ndn_msg_t);
  size_t space;
  ndn_msg_t* ret;

  // defrag the memory
  ndn_msgqueue_empty();

  if(pfront > ptail) {
    // -1 is to prevent (ptail == pfront) after call
    space = ((uint8_t*)pfront) - ((uint8_t*)ptail) - 1;
  } else {
    space = (&msg_queue[NDN_MSGQUEUE_SIZE] - ((uint8_t*)ptail));
  }

  // After tail?
  if(pfront >= ptail || space >= len + sizeof(ndn_msg_t)){
    // No-padding (= is to prevent ptail == pfront after call)
    if(space < len || (space == len && pfront == (ndn_msg_t*)&msg_queue))
      return NULL;
  } else {
    // Padding & rewind (= is to prevent ptail == pfront after call)
    if(((uint8_t*)pfront) - &msg_queue[0] <= (int) len)
      return NULL;

    if(space >= sizeof(ndn_msg_t)){
      ptail->func = NDN_MSG_PADDING;
      ptail->length = space;
      ptail = (ndn_msg_t*)&msg_queue[0];
    }else{
      // This should never happen
      return NULL;
    }
  }

  ptail->obj = target;
  ptail->func = reason;
  ptail->length = len;
  if(param_length > 0){
    memcpy(ptail->param, param, param_length);
  }

  ret = ptail;
  MSGQUEUE_NEXT(ptail);

  return ret;
}